

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgOptimizationUtils.hpp
# Opt level: O2

void TasOptimization::checkVarSize(string *method_name,string *var_name,int var_size,int exp_size)

{
  runtime_error *this;
  string sStack_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (var_size == exp_size) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_128,"Size of ",var_name);
  std::operator+(&local_108,&local_128," (");
  std::__cxx11::to_string(&local_148,var_size);
  std::operator+(&local_e8,&local_108,&local_148);
  std::operator+(&local_c8,&local_e8,") in the function ");
  std::operator+(&local_a8,&local_c8,method_name);
  std::operator+(&local_88,&local_a8,"() is not equal to its expected value of (");
  std::__cxx11::to_string(&sStack_168,exp_size);
  std::operator+(&local_68,&local_88,&sStack_168);
  std::operator+(&local_48,&local_68,")");
  std::runtime_error::runtime_error(this,(string *)&local_48);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void checkVarSize(const std::string method_name, const std::string var_name, const int var_size, const int exp_size) {
    if (var_size != exp_size) {
        throw std::runtime_error("Size of " + var_name + " (" + std::to_string(var_size) + ") in the function " + method_name +
                                 "() is not equal to its expected value of (" + std::to_string(exp_size) + ")");
    }
}